

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallExportGenerator.cxx
# Opt level: O0

string * __thiscall
cmInstallExportGenerator::GetTempDir_abi_cxx11_
          (string *__return_storage_ptr__,cmInstallExportGenerator *this)

{
  ulong uVar1;
  cmInstallExportGenerator *this_local;
  
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->TempDir);
  }
  else {
    TempDirCalculate_abi_cxx11_(__return_storage_ptr__,this);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmInstallExportGenerator::GetTempDir() const
{
  if (this->TempDir.empty()) {
    return this->TempDirCalculate();
  }
  return this->TempDir;
}